

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RawBrandedSchema * __thiscall kj::Arena::allocate<capnp::_::RawBrandedSchema>(Arena *this)

{
  RawBrandedSchema *pRVar1;
  RawBrandedSchema *result;
  Arena *this_local;
  
  pRVar1 = (RawBrandedSchema *)allocateBytes(this,0x28,8,false);
  return pRVar1;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}